

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.c
# Opt level: O2

void render_border(WINDOW_conflict *window)

{
  wborder_set(window,&render_border::BOX_VERT,&render_border::BOX_VERT,&render_border::BOX_HORIZ,
              &render_border::BOX_HORIZ,&render_border::BOX_TOP_LEFT,&render_border::BOX_TOP_RIGHT,
              &render_border::BOX_BOTTOM_LEFT,&render_border::BOX_BOTTOM_RIGHT);
  return;
}

Assistant:

void
render_border(WINDOW *window)
{
    static const cchar_t BOX_VERT = { 0, { L'║' } };
    static const cchar_t BOX_HORIZ = { 0, { L'═' } };
    static const cchar_t BOX_TOP_LEFT = { 0, { L'╔' } };
    static const cchar_t BOX_TOP_RIGHT = { 0, { L'╗' } };
    static const cchar_t BOX_BOTTOM_LEFT = { 0, { L'╚' } };
    static const cchar_t BOX_BOTTOM_RIGHT = { 0, { L'╝' } };

    wborder_set(window, &BOX_VERT, &BOX_VERT, &BOX_HORIZ, &BOX_HORIZ,
            &BOX_TOP_LEFT, &BOX_TOP_RIGHT, &BOX_BOTTOM_LEFT, &BOX_BOTTOM_RIGHT);
}